

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitter.cpp
# Opt level: O0

Emitter * __thiscall YAML::Emitter::Write(Emitter *this,_Alias *alias)

{
  bool bVar1;
  pointer pEVar2;
  Emitter *in_RDI;
  string *in_stack_ffffffffffffff58;
  EmitterState *in_stack_ffffffffffffff60;
  undefined8 in_stack_ffffffffffffff68;
  value child;
  allocator *paVar3;
  Emitter *in_stack_ffffffffffffff70;
  allocator local_71;
  string local_70 [55];
  allocator local_39;
  string local_38 [56];
  
  child = (value)((ulong)in_stack_ffffffffffffff68 >> 0x20);
  bVar1 = good((Emitter *)0xef97c9);
  if (bVar1) {
    pEVar2 = std::unique_ptr<YAML::EmitterState,_std::default_delete<YAML::EmitterState>_>::
             operator->((unique_ptr<YAML::EmitterState,_std::default_delete<YAML::EmitterState>_> *)
                        0xef97e9);
    bVar1 = EmitterState::HasAnchor(pEVar2);
    if (!bVar1) {
      pEVar2 = std::unique_ptr<YAML::EmitterState,_std::default_delete<YAML::EmitterState>_>::
               operator->((unique_ptr<YAML::EmitterState,_std::default_delete<YAML::EmitterState>_>
                           *)0xef97ff);
      bVar1 = EmitterState::HasTag(pEVar2);
      if (!bVar1) {
        PrepareNode(in_stack_ffffffffffffff70,child);
        bVar1 = Utils::WriteAlias((ostream_wrapper *)in_stack_ffffffffffffff60,
                                  in_stack_ffffffffffffff58);
        if (!bVar1) {
          pEVar2 = std::unique_ptr<YAML::EmitterState,_std::default_delete<YAML::EmitterState>_>::
                   operator->((unique_ptr<YAML::EmitterState,_std::default_delete<YAML::EmitterState>_>
                               *)0xef98eb);
          paVar3 = &local_71;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_70,"invalid alias",paVar3);
          EmitterState::SetError(pEVar2,in_stack_ffffffffffffff58);
          std::__cxx11::string::~string(local_70);
          std::allocator<char>::~allocator((allocator<char> *)&local_71);
          return in_RDI;
        }
        StartedScalar((Emitter *)0xef9989);
        pEVar2 = std::unique_ptr<YAML::EmitterState,_std::default_delete<YAML::EmitterState>_>::
                 operator->((unique_ptr<YAML::EmitterState,_std::default_delete<YAML::EmitterState>_>
                             *)0xef9993);
        EmitterState::SetAlias(pEVar2);
        return in_RDI;
      }
    }
    std::unique_ptr<YAML::EmitterState,_std::default_delete<YAML::EmitterState>_>::operator->
              ((unique_ptr<YAML::EmitterState,_std::default_delete<YAML::EmitterState>_> *)0xef981a)
    ;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_38,"invalid alias",&local_39);
    EmitterState::SetError(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    std::__cxx11::string::~string(local_38);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
  }
  return in_RDI;
}

Assistant:

Emitter& Emitter::Write(const _Alias& alias) {
  if (!good())
    return *this;

  if (m_pState->HasAnchor() || m_pState->HasTag()) {
    m_pState->SetError(ErrorMsg::INVALID_ALIAS);
    return *this;
  }

  PrepareNode(EmitterNodeType::Scalar);

  if (!Utils::WriteAlias(m_stream, alias.content)) {
    m_pState->SetError(ErrorMsg::INVALID_ALIAS);
    return *this;
  }

  StartedScalar();

  m_pState->SetAlias();

  return *this;
}